

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O3

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* getHookScriptNames(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *__return_storage_ptr__,Configuration *config,string *name)

{
  _Rb_tree_header *p_Var1;
  _Alloc_hider _Var2;
  ulong uVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  pointer pbVar8;
  bool bVar9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long *local_68;
  ulong local_60;
  long local_58;
  long lStack_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::operator+(&local_88,"hook.",name);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
  local_68 = &local_58;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_58 = *plVar7;
    lStack_50 = plVar5[3];
  }
  else {
    local_58 = *plVar7;
    local_68 = (long *)*plVar5;
  }
  local_60 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  uVar3 = local_60;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  Configuration::all_abi_cxx11_(&local_48,config);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__cxx11::string::substr((ulong)&local_88,(ulong)pbVar8);
      _Var2._M_p = local_88._M_dataplus._M_p;
      if (local_88._M_string_length == local_60) {
        if (local_88._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar4 = bcmp(local_88._M_dataplus._M_p,local_68,local_88._M_string_length);
          bVar9 = iVar4 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_88.field_2) {
        operator_delete(_Var2._M_p);
      }
      if (bVar9) {
        lVar6 = std::__cxx11::string::find((char *)pbVar8,0x140ffa,uVar3);
        if (lVar6 != -1) {
          std::__cxx11::string::substr((ulong)&local_88,(ulong)pbVar8);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)__return_storage_ptr__,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
        }
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set <std::string> getHookScriptNames (
  const Configuration& config,
  const std::string& name)
{
  auto key = "hook." + name + ".";
  auto len = key.length ();

  std::set <std::string> names;
  for (const auto& item : config.all ())
  {
    if (item.substr (0, len) == key)
    {
      auto period = item.find (".", len);
      if (period != std::string::npos)
        names.insert (item.substr (len, period - len));
    }
  }

  return names;
}